

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O0

handle pybind11::detail::
       list_caster<std::vector<anurbs::Ref<anurbs::NurbsCurveGeometry<2l>>,std::allocator<anurbs::Ref<anurbs::NurbsCurveGeometry<2l>>>>,anurbs::Ref<anurbs::NurbsCurveGeometry<2l>>>
       ::
       cast<std::vector<anurbs::Ref<anurbs::NurbsCurveGeometry<2l>>,std::allocator<anurbs::Ref<anurbs::NurbsCurveGeometry<2l>>>>const&>
                 (vector<anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>,_std::allocator<anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>_>
                  *src,return_value_policy policy,handle parent)

{
  PyObject *pPVar1;
  bool bVar2;
  int iVar3;
  size_type size;
  forwarded_type<const_std::vector<anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>_&,_const_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_&>
  src_00;
  PyObject **ppPVar4;
  handle local_90;
  int local_84;
  PyObject *local_80;
  PyObject *local_68;
  handle local_60;
  object value_;
  Ref<anurbs::NurbsCurveGeometry<2L>_> *value;
  const_iterator __end0;
  const_iterator __begin0;
  vector<anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>,_std::allocator<anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>_>
  *__range3;
  size_t index;
  list l;
  return_value_policy policy_local;
  vector<anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>,_std::allocator<anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>_>
  *src_local;
  handle parent_local;
  
  l.super_object.super_handle.m_ptr._7_1_ = policy;
  size = std::
         vector<anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>,_std::allocator<anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>_>
         ::size(src);
  pybind11::list::list((list *)&index,size);
  __range3 = (vector<anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>,_std::allocator<anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>_>
              *)0x0;
  __end0 = std::
           vector<anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>,_std::allocator<anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>_>
           ::begin(src);
  value = (Ref<anurbs::NurbsCurveGeometry<2L>_> *)
          std::
          vector<anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>,_std::allocator<anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>_>
          ::end(src);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_*,_std::vector<anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>,_std::allocator<anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>_>_>
                                *)&value);
    if (!bVar2) break;
    value_.super_handle.m_ptr =
         (handle)__gnu_cxx::
                 __normal_iterator<const_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_*,_std::vector<anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>,_std::allocator<anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>_>_>
                 ::operator*(&__end0);
    src_00 = forward_like<std::vector<anurbs::Ref<anurbs::NurbsCurveGeometry<2l>>,std::allocator<anurbs::Ref<anurbs::NurbsCurveGeometry<2l>>>>const&,anurbs::Ref<anurbs::NurbsCurveGeometry<2l>>const&>
                       ((Ref<anurbs::NurbsCurveGeometry<2L>_> *)value_.super_handle.m_ptr);
    local_80 = parent.m_ptr;
    local_68 = (PyObject *)
               type_caster_base<anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>::cast
                         (src_00,l.super_object.super_handle.m_ptr._7_1_,parent);
    reinterpret_steal<pybind11::object>((pybind11 *)&local_60,(handle)local_68);
    bVar2 = handle::operator_cast_to_bool(&local_60);
    if (bVar2) {
      local_90 = pybind11::object::release((object *)&local_60);
      ppPVar4 = handle::ptr(&local_90);
      pPVar1 = *ppPVar4;
      ppPVar4 = handle::ptr((handle *)&index);
      iVar3 = PyType_HasFeature((*ppPVar4)->ob_type,0x2000000);
      if (iVar3 == 0) {
        __assert_fail("PyList_Check(l.ptr())",
                      "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/pybind11/include/pybind11/stl.h"
                      ,0xb2,
                      "static handle pybind11::detail::list_caster<std::vector<anurbs::Ref<anurbs::NurbsCurveGeometry<2>>>, anurbs::Ref<anurbs::NurbsCurveGeometry<2>>>::cast(T &&, return_value_policy, handle) [Type = std::vector<anurbs::Ref<anurbs::NurbsCurveGeometry<2>>>, Value = anurbs::Ref<anurbs::NurbsCurveGeometry<2>>, T = const std::vector<anurbs::Ref<anurbs::NurbsCurveGeometry<2>>> &]"
                     );
      }
      ppPVar4 = handle::ptr((handle *)&index);
      (&(((*ppPVar4)[1].ob_type)->ob_base).ob_base.ob_refcnt)[(long)__range3] = (Py_ssize_t)pPVar1;
      local_84 = 0;
      __range3 = (vector<anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>,_std::allocator<anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>_>
                  *)((long)&(__range3->
                            super__Vector_base<anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>,_std::allocator<anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1);
    }
    else {
      memset(&parent_local,0,8);
      handle::handle(&parent_local);
      local_84 = 1;
    }
    pybind11::object::~object((object *)&local_60);
    if (local_84 != 0) goto LAB_004b3a36;
    __gnu_cxx::
    __normal_iterator<const_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_*,_std::vector<anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>,_std::allocator<anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>_>_>
    ::operator++(&__end0);
  }
  parent_local = pybind11::object::release((object *)&index);
  local_84 = 1;
LAB_004b3a36:
  pybind11::list::~list((list *)&index);
  return (handle)parent_local.m_ptr;
}

Assistant:

static handle cast(T &&src, return_value_policy policy, handle parent) {
        if (!std::is_lvalue_reference<T>::value)
            policy = return_value_policy_override<Value>::policy(policy);
        list l(src.size());
        size_t index = 0;
        for (auto &&value : src) {
            auto value_ = reinterpret_steal<object>(value_conv::cast(forward_like<T>(value), policy, parent));
            if (!value_)
                return handle();
            PyList_SET_ITEM(l.ptr(), (ssize_t) index++, value_.release().ptr()); // steals a reference
        }
        return l.release();
    }